

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderstyle.cpp
# Opt level: O1

bool __thiscall FRenderStyle::IsVisible(FRenderStyle *this,double alpha)

{
  FRenderStyle FVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  
  FVar1 = *this;
  if (FVar1 == (FRenderStyle)0x0) {
    bVar2 = false;
  }
  else {
    if ((FVar1 != (FRenderStyle)0x3) && (FVar1 != (FRenderStyle)0x1)) {
      return true;
    }
    if (((byte)this[3] & 2) == 0) {
      dVar3 = 1.0;
      if (alpha <= 1.0) {
        dVar3 = alpha;
      }
      dVar3 = (double)(-(ulong)(0.0 < alpha) & (ulong)dVar3);
    }
    else {
      dVar3 = 1.0;
    }
    FVar1 = this[1];
    if (FVar1 == (FRenderStyle)0x3) {
      dVar4 = 1.0 - dVar3;
    }
    else {
      dVar4 = dVar3;
      if ((FVar1 != (FRenderStyle)0x2) && (dVar4 = 0.0, FVar1 == (FRenderStyle)0x1)) {
        dVar4 = 65536.0;
      }
    }
    bVar2 = true;
    if ((dVar4 == 0.0) && (!NAN(dVar4))) {
      FVar1 = this[2];
      if (FVar1 == (FRenderStyle)0x3) {
        dVar3 = 1.0 - dVar3;
      }
      else if ((FVar1 != (FRenderStyle)0x2) && (dVar3 = 0.0, FVar1 == (FRenderStyle)0x1)) {
        dVar3 = 65536.0;
      }
      return (bool)(-(dVar3 != 1.0) & 1);
    }
  }
  return bVar2;
}

Assistant:

bool FRenderStyle::IsVisible(double alpha) const throw()
{
	if (BlendOp == STYLEOP_None)
	{
		return false;
	}
	if (BlendOp == STYLEOP_Add || BlendOp == STYLEOP_RevSub)
	{
		if (Flags & STYLEF_Alpha1)
		{
			alpha = 1.;
		}
		else
		{
			alpha = clamp(alpha, 0., 1.);
		}
		return GetAlpha(SrcAlpha, alpha) != 0 || GetAlpha(DestAlpha, alpha) != 1;
	}
	// Treat anything else as visible.
	return true;
}